

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

type LBFGS(Mesh *mesh,VectorXd *x,double *error)

{
  XprTypeNested *ppMVar1;
  double *pdVar2;
  undefined *puVar3;
  XprTypeNested pMVar4;
  double *pdVar5;
  double dVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Scalar SVar10;
  Scalar SVar11;
  double dVar12;
  undefined1 auVar13 [12];
  XprType XVar14;
  PolyConnectivity *pPVar15;
  int iVar16;
  undefined8 uVar17;
  long *plVar18;
  _IOManager_ *this;
  undefined **ppuVar19;
  ostream *poVar20;
  undefined8 *puVar21;
  double *in_RCX;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar22;
  double *pdVar23;
  XprType *pXVar24;
  ulong uVar25;
  ulong uVar26;
  Index extraout_RDX;
  uint uVar27;
  long lVar28;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar29;
  uint uVar30;
  ActualDstType actualDst;
  XprType *pXVar31;
  double dVar32;
  uint uVar33;
  IO *this_00;
  long lVar34;
  ActualDstType actualDst_2;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  ActualDstType actualDst_1;
  uint uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar38;
  type tVar39;
  undefined1 auVar40 [12];
  VectorXd r;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin2;
  VertexHandle handles [10];
  VectorXd gradx;
  VectorXd q;
  VectorXd gradx0;
  double epsilon;
  VectorXd ys [7];
  VectorXd ss [7];
  double rhos [7];
  Mesh omesh;
  double alphas [7];
  undefined4 local_4bc;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4b8;
  undefined1 local_4a8 [16];
  Matrix<double,__1,_1,_0,__1,_1> local_498;
  undefined1 local_488 [8];
  XprType *pXStack_480;
  double local_478;
  XprType *pXStack_470;
  undefined8 local_468;
  XprType *local_460;
  ulong local_450;
  undefined1 local_448 [24];
  undefined1 local_430 [16];
  DenseStorage<double,__1,__1,_1,_0> local_420;
  XprType local_410;
  Scalar local_400;
  PolyConnectivity *local_3f8;
  DenseStorage<double,__1,__1,_1,_0> local_3f0;
  double local_3e0 [2];
  Mesh *local_3d0;
  double local_3c8;
  ulong local_3c0;
  double *local_3b8;
  double local_3b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  double *local_348 [2];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  pointer local_318;
  pointer pAStack_310;
  pointer local_308;
  pointer ppStack_300;
  pointer local_2f8;
  pointer ppStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  double adStack_2c8 [7];
  undefined1 local_290 [16];
  XprType *local_280;
  XprType *local_278;
  vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_> local_1c8 [8];
  iterator local_1c0;
  Vertex *local_1b8;
  BaseHandle local_f0;
  double adStack_68 [7];
  
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = (pointer)0x0;
  ppStack_2f0 = (pointer)0x0;
  local_308 = (pointer)0x0;
  ppStack_300 = (pointer)0x0;
  local_318 = (pointer)0x0;
  pAStack_310 = (pointer)0x0;
  local_328 = 0;
  uStack_320 = 0;
  local_338.m_storage.m_data = (double *)0x0;
  local_338.m_storage.m_rows = 0;
  local_348[0] = (double *)0x0;
  local_348[1] = (double *)0x0;
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8.m_storage.m_data = (double *)0x0;
  local_3a8.m_storage.m_rows = 0;
  local_3d0 = mesh;
  local_3b8 = in_RCX;
  local_3c8 = getAveLen((Mesh *)x,(VectorXd *)error);
  local_3c8 = local_3c8 * 0.25;
  local_3b0 = local_3c8;
  calcGrad((Mesh *)local_430,x,local_3c8);
  uVar26 = 0;
  local_3f8 = (PolyConnectivity *)x;
  do {
    local_450 = uVar26;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::AttribKernelT((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                     *)local_290);
    local_290._0_8_ = &PTR__PolyConnectivity_001b1228;
    if (0 < (long)error[1]) {
      lVar28 = 0;
      do {
        local_448._0_16_ = *(undefined1 (*) [16])((long)*error + lVar28 * 8);
        local_488._0_4_ = 0xffffffff;
        if (local_1c0._M_current == local_1b8) {
          std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
          _M_realloc_insert<OpenMesh::ArrayItems::Vertex>(local_1c8,local_1c0,(Vertex *)local_488);
        }
        else {
          ((local_1c0._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
          local_1c0._M_current = local_1c0._M_current + 1;
        }
        uVar17 = (*(code *)(((XprTypeNested)(local_290._0_8_ + 0x10))->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data)(local_290);
        pXVar24 = local_278;
        for (pXVar31 = local_280; pXVar31 != pXVar24; pXVar31 = (XprType *)&pXVar31->field_0x8) {
          pMVar4 = pXVar31->m_xpr;
          if (pMVar4 != (XprTypeNested)0x0) {
            (*(code *)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data[3])(pMVar4,uVar17);
          }
        }
        iVar16 = OpenMesh::ArrayKernel::handle((ArrayKernel *)local_290,local_1c0._M_current + -1);
        pdVar23 = (&local_280->m_xpr)[local_f0.idx_][3].
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        *(ulong *)((long)pdVar23 + (long)iVar16 * 0xc) =
             CONCAT44((float)(double)local_448._8_8_,(float)(double)local_448._0_8_);
        *(undefined4 *)((long)pdVar23 + (long)iVar16 * 0xc + 8) = 0;
        lVar28 = lVar28 + 2;
      } while (lVar28 < (long)error[1]);
    }
    pPVar15 = local_3f8;
    local_4a8 = OpenMesh::PolyConnectivity::faces_begin(local_3f8);
    auVar40 = OpenMesh::PolyConnectivity::faces_end(pPVar15);
    auVar13 = local_4a8._0_12_;
    iVar16 = local_4a8._8_4_;
    while (auVar40 != auVar13) {
      local_478 = -NAN;
      pXStack_470 = (XprType *)0xffffffffffffffff;
      local_488 = (undefined1  [8])0xffffffffffffffff;
      pXStack_480 = (XprType *)0xffffffffffffffff;
      local_468 = 0xffffffffffffffff;
      uVar27 = *(uint *)(*(long *)&pPVar15->field_0xf8 + (long)iVar16 * 4);
      if ((int)uVar27 < 0) {
        uVar26 = 0;
      }
      else {
        lVar28 = *(long *)&pPVar15->field_0xe0;
        uVar26 = 0;
        uVar33 = 0;
        uVar30 = uVar27;
        do {
          do {
            lVar34 = (long)((int)uVar30 >> 1) * 0x20 + lVar28;
            uVar25 = (ulong)((uVar30 & 1) << 4);
            *(undefined4 *)(local_488 + uVar26 * 4) = *(undefined4 *)(uVar25 + 4 + lVar34);
            uVar26 = uVar26 + 1;
            uVar30 = *(uint *)(uVar25 + 8 + lVar34);
            uVar33 = uVar33 + (uVar30 == uVar27);
          } while (uVar30 != uVar27);
        } while (uVar33 != ~uVar27 >> 0x1f);
        uVar26 = uVar26 & 0xffffffff;
      }
      OpenMesh::PolyConnectivity::add_face
                ((PolyConnectivity *)local_290,(VertexHandle *)local_488,uVar26);
      iVar16 = local_4a8._8_4_ + 1;
      local_4a8._8_4_ = iVar16;
      if (local_4a8._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_4a8);
        iVar16 = local_4a8._8_4_;
      }
      auVar13._8_4_ = iVar16;
      auVar13._0_8_ = local_4a8._0_8_;
    }
    uVar27 = (uint)local_450;
    local_3c0 = local_450 & 0xffffffff;
    if ((uVar27 == 1) || (uVar27 + (int)(local_3c0 / 10) * -10 == 0)) {
      uVar30 = 1;
      if (9 < uVar27) {
        uVar33 = 4;
        uVar26 = local_450;
        do {
          uVar30 = uVar33;
          uVar35 = (uint)uVar26;
          if (uVar35 < 100) {
            uVar30 = uVar30 - 2;
            goto LAB_0013da20;
          }
          if (uVar35 < 1000) {
            uVar30 = uVar30 - 1;
            goto LAB_0013da20;
          }
          if (uVar35 < 10000) goto LAB_0013da20;
          uVar26 = (uVar26 & 0xffffffff) / 10000;
          uVar33 = uVar30 + 4;
        } while (99999 < uVar35);
        uVar30 = uVar30 + 1;
      }
LAB_0013da20:
      local_3f0.m_data = local_3e0;
      std::__cxx11::string::_M_construct((ulong)&local_3f0,(char)uVar30);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3f0.m_data,uVar30,uVar27);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_3f0);
      pXVar31 = (XprType *)(plVar18 + 2);
      if ((XprType *)*plVar18 == pXVar31) {
        local_410.m_xpr = pXVar31->m_xpr;
        local_410._8_8_ = plVar18[3];
        local_420.m_data = (double *)&local_410;
      }
      else {
        local_410.m_xpr = pXVar31->m_xpr;
        local_420.m_data = (double *)*plVar18;
      }
      local_420.m_rows = plVar18[1];
      *plVar18 = (long)pXVar31;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_420);
      pMVar22 = (Matrix<double,__1,_1,_0,__1,_1> *)(plVar18 + 2);
      if ((Matrix<double,__1,_1,_0,__1,_1> *)*plVar18 == pMVar22) {
        local_498.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_498.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             plVar18[3];
        local_4a8._0_8_ = &local_498;
      }
      else {
        local_498.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_4a8._0_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)*plVar18;
      }
      local_4a8._8_8_ = plVar18[1];
      *plVar18 = (long)pMVar22;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      this_00 = (IO *)local_4a8;
      plVar18 = (long *)std::__cxx11::string::append((char *)this_00);
      pdVar23 = (double *)(plVar18 + 2);
      if ((double *)*plVar18 == pdVar23) {
        local_478 = *pdVar23;
        pXStack_470 = (XprType *)plVar18[3];
        local_488 = (undefined1  [8])&local_478;
      }
      else {
        local_478 = *pdVar23;
        local_488 = (undefined1  [8])*plVar18;
      }
      pXStack_480 = (XprType *)plVar18[1];
      *plVar18 = (long)pdVar23;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      local_4b8.m_storage.m_data = (double *)&PTR__BaseExporter_001b1970;
      local_4b8.m_storage.m_rows = (Index)local_290;
      this = (_IOManager_ *)OpenMesh::IO::IOManager(this_00);
      local_4bc = 0;
      OpenMesh::IO::_IOManager_::write
                (this,(string *)local_488,(BaseExporter *)&local_4b8,(Options)(value_type)&local_4bc
                 ,6);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,(long)local_478 + 1);
      }
      uVar27 = (uint)local_450;
      if ((Matrix<double,__1,_1,_0,__1,_1> *)local_4a8._0_8_ != &local_498) {
        operator_delete((void *)local_4a8._0_8_,
                        (long)local_498.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
      }
      if ((XprType *)local_420.m_data != &local_410) {
        operator_delete(local_420.m_data,
                        (ulong)((long)&((local_410.m_xpr)->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data + 1));
      }
      if (local_3f0.m_data != local_3e0) {
        operator_delete(local_3f0.m_data,(long)local_3e0[0] + 1);
      }
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_420,(DenseStorage<double,__1,__1,_1,_0> *)local_430);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_3f0,(DenseStorage<double,__1,__1,_1,_0> *)local_430);
    pXVar31 = (XprType *)error[1];
    local_4b8.m_storage.m_data = (double *)0x0;
    local_4b8.m_storage.m_rows = 0;
    ppuVar19 = (undefined **)local_4b8.m_storage.m_data;
    if (pXVar31 != (XprType *)0x0) {
      if ((ulong)pXVar31 >> 0x3d != 0) {
LAB_0013e63c:
        puVar21 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar21 = std::streambuf::xsgetn;
        __cxa_throw(puVar21,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      ppuVar19 = (undefined **)malloc((long)pXVar31 * 8);
      if (ppuVar19 == (undefined **)0x0) goto LAB_0013e63c;
    }
    local_4b8.m_storage.m_data = (double *)ppuVar19;
    uVar30 = 7;
    if (7 < (int)uVar27) {
      uVar30 = uVar27;
    }
    uVar30 = uVar30 - 7;
    uVar33 = uVar27 - 1;
    local_4b8.m_storage.m_rows = (Index)pXVar31;
    if (uVar30 < uVar27) {
      do {
        uVar35 = uVar33 % 7;
        local_4a8._8_8_ = (long)&local_338.m_storage.m_data + (ulong)(uVar35 * 0x10);
        local_4a8._0_8_ = &local_420;
        if (*(long *)((long)&local_338.m_storage.m_rows + (ulong)(uVar35 * 0x10)) == 0) {
          uVar36 = 0;
          uVar37 = 0;
        }
        else {
          pXStack_480 = (XprType *)local_420.m_data;
          pXStack_470 = (XprType *)
                        (((RhsNested)local_4a8._8_8_)->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data;
          local_460 = (XprType *)local_4a8;
          SVar10 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                   ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)local_488,(scalar_sum_op<double,_double> *)&local_4bc);
          uVar36 = SUB84(SVar10,0);
          uVar37 = (undefined4)((ulong)SVar10 >> 0x20);
        }
        dVar38 = (double)CONCAT44(uVar37,uVar36) * adStack_2c8[uVar35];
        adStack_68[uVar35] = dVar38;
        pdVar23 = (&local_3a8)[uVar35].m_storage.m_data;
        pXVar31 = (XprType *)(local_420.m_rows - (local_420.m_rows >> 0x3f) & 0xfffffffffffffffe);
        if (1 < local_420.m_rows) {
          lVar28 = 0;
          do {
            pdVar5 = pdVar23 + lVar28;
            dVar6 = pdVar5[1];
            dVar32 = (double)((XprTypeNested *)local_420.m_data + lVar28)[1];
            ((XprTypeNested *)local_420.m_data)[lVar28] =
                 (XprTypeNested)
                 ((double)((XprTypeNested *)local_420.m_data)[lVar28] - *pdVar5 * dVar38);
            ((XprTypeNested *)local_420.m_data + lVar28)[1] =
                 (XprTypeNested)(dVar32 - dVar6 * dVar38);
            lVar28 = lVar28 + 2;
          } while (lVar28 < (long)pXVar31);
        }
        if ((long)pXVar31 < local_420.m_rows) {
          do {
            ((XprTypeNested *)local_420.m_data)[(long)pXVar31] =
                 (XprTypeNested)
                 ((double)((XprTypeNested *)local_420.m_data)[(long)pXVar31] -
                 pdVar23[(long)pXVar31] * dVar38);
            pXVar31 = (XprType *)((long)&pXVar31->m_xpr + 1);
          } while ((XprType *)local_420.m_rows != pXVar31);
        }
        bVar7 = (int)uVar30 < (int)uVar33;
        uVar33 = uVar33 - 1;
      } while (bVar7);
    }
    pdVar23 = local_420.m_data;
    uVar33 = (uint)local_450;
    if (uVar33 == 0) {
      pXVar31 = (XprType *)local_420.m_rows;
      if (local_4b8.m_storage.m_rows != local_420.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_4b8,local_420.m_rows,1);
        pXVar31 = (XprType *)local_4b8.m_storage.m_rows;
      }
      pXVar24 = (XprType *)((long)pXVar31 - ((long)pXVar31 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)pXVar31) {
        lVar28 = 0;
        do {
          ppMVar1 = (XprTypeNested *)pdVar23 + lVar28;
          puVar3 = (undefined *)ppMVar1[1];
          local_4b8.m_storage.m_data[lVar28] = (double)*ppMVar1;
          (local_4b8.m_storage.m_data + lVar28)[1] = (double)puVar3;
          lVar28 = lVar28 + 2;
        } while (lVar28 < (long)pXVar24);
      }
      if ((long)pXVar24 < (long)pXVar31) {
        do {
          local_4b8.m_storage.m_data[(long)pXVar24] =
               (double)((XprTypeNested *)pdVar23)[(long)pXVar24];
          pXVar24 = (XprType *)((long)&pXVar24->m_xpr + 1);
        } while (pXVar31 != pXVar24);
      }
    }
    else {
      iVar16 = (int)(uVar27 - 1) % 7;
      local_4a8._0_8_ = &local_338 + iVar16;
      pPVar29 = &local_3a8 + iVar16;
      if ((&local_3a8)[iVar16].m_storage.m_rows == 0) {
        local_448._0_16_ = ZEXT816(0);
LAB_0013df49:
        local_400 = 0.0;
        local_4a8._8_8_ = pPVar29;
      }
      else {
        pXStack_480 = (XprType *)
                      (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4a8._0_8_)
                      ->m_storage).m_data;
        pXStack_470 = (XprType *)(pPVar29->m_storage).m_data;
        local_460 = (XprType *)local_4a8;
        local_4a8._8_8_ = pPVar29;
        SVar10 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                 ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_488,(scalar_sum_op<double,_double> *)&local_4bc);
        local_448._8_4_ = extraout_XMM0_Dc;
        local_448._0_8_ = SVar10;
        local_448._12_4_ = extraout_XMM0_Dd;
        local_4a8._0_8_ = pPVar29;
        if ((&local_3a8)[iVar16].m_storage.m_rows == 0) goto LAB_0013df49;
        pXStack_480 = (XprType *)(pPVar29->m_storage).m_data;
        local_460 = (XprType *)local_4a8;
        local_4a8._8_8_ = pPVar29;
        pXStack_470 = pXStack_480;
        local_400 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                    ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_488,(scalar_sum_op<double,_double> *)&local_4bc);
      }
      pdVar23 = local_420.m_data;
      pXVar31 = (XprType *)local_420.m_rows;
      if (local_4b8.m_storage.m_rows != local_420.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_4b8,local_420.m_rows,1);
        pXVar31 = (XprType *)local_4b8.m_storage.m_rows;
      }
      XVar14._8_8_ = local_4a8._8_8_;
      XVar14.m_xpr = (XprTypeNested)local_4a8._0_8_;
      uVar36 = local_448._12_4_;
      dVar38 = local_448._0_8_ / local_400;
      local_448._8_4_ = local_448._8_4_;
      local_448._0_8_ = dVar38;
      local_448._12_4_ = uVar36;
      pXVar24 = (XprType *)((long)pXVar31 - ((long)pXVar31 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)pXVar31) {
        lVar28 = 0;
        do {
          ppMVar1 = (XprTypeNested *)pdVar23 + lVar28;
          dVar6 = (double)ppMVar1[1];
          local_4b8.m_storage.m_data[lVar28] = (double)((double)*ppMVar1 * dVar38);
          (local_4b8.m_storage.m_data + lVar28)[1] = (double)(dVar6 * dVar38);
          lVar28 = lVar28 + 2;
        } while (lVar28 < (long)pXVar24);
      }
      if ((long)pXVar24 < (long)pXVar31) {
        do {
          local_4b8.m_storage.m_data[(long)pXVar24] =
               (double)((double)((XprTypeNested *)pdVar23)[(long)pXVar24] * dVar38);
          pXVar24 = (XprType *)((long)&pXVar24->m_xpr + 1);
          local_4a8 = (undefined1  [16])XVar14;
        } while (pXVar31 != pXVar24);
      }
    }
    if (uVar30 < uVar33) {
      do {
        uVar27 = uVar30 % 7;
        dVar38 = adStack_2c8[uVar27];
        local_4a8._8_8_ = (long)&local_3a8.m_storage.m_data + (ulong)(uVar27 * 0x10);
        local_4a8._0_8_ = &local_4b8;
        if (*(long *)((long)&local_3a8.m_storage.m_rows + (ulong)(uVar27 * 0x10)) == 0) {
          uVar36 = 0;
          uVar37 = 0;
        }
        else {
          local_448._0_8_ = dVar38;
          pXStack_480 = (XprType *)local_4b8.m_storage.m_data;
          pXStack_470 = (XprType *)
                        (((RhsNested)local_4a8._8_8_)->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data;
          local_460 = (XprType *)local_4a8;
          SVar10 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                   ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)local_488,(scalar_sum_op<double,_double> *)&local_4bc);
          uVar36 = SUB84(SVar10,0);
          uVar37 = (undefined4)((ulong)SVar10 >> 0x20);
          dVar38 = (double)local_448._0_8_;
        }
        dVar38 = adStack_68[uVar27] - dVar38 * (double)CONCAT44(uVar37,uVar36);
        pdVar23 = (&local_338)[uVar27].m_storage.m_data;
        pXVar31 = (XprType *)
                  (local_4b8.m_storage.m_rows - (local_4b8.m_storage.m_rows >> 0x3f) &
                  0xfffffffffffffffe);
        if (1 < local_4b8.m_storage.m_rows) {
          lVar28 = 0;
          do {
            pdVar5 = pdVar23 + lVar28;
            dVar6 = pdVar5[1];
            puVar3 = (undefined *)(local_4b8.m_storage.m_data + lVar28)[1];
            local_4b8.m_storage.m_data[lVar28] =
                 (double)(*pdVar5 * dVar38 + (double)local_4b8.m_storage.m_data[lVar28]);
            (local_4b8.m_storage.m_data + lVar28)[1] = (double)(dVar6 * dVar38 + (double)puVar3);
            lVar28 = lVar28 + 2;
          } while (lVar28 < (long)pXVar31);
        }
        if ((long)pXVar31 < local_4b8.m_storage.m_rows) {
          do {
            local_4b8.m_storage.m_data[(long)pXVar31] =
                 (double)(pdVar23[(long)pXVar31] * dVar38 +
                         (double)local_4b8.m_storage.m_data[(long)pXVar31]);
            pXVar31 = (XprType *)((long)&pXVar31->m_xpr + 1);
          } while ((XprType *)local_4b8.m_storage.m_rows != pXVar31);
        }
        uVar30 = uVar30 + 1;
      } while ((int)uVar30 < (int)uVar33);
    }
    local_488 = (undefined1  [8])0x0;
    pXStack_480 = (XprType *)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_488,
               local_4b8.m_storage.m_rows,1);
    pdVar23 = local_4b8.m_storage.m_data;
    pXVar31 = (XprType *)local_4b8.m_storage.m_rows;
    if (pXStack_480 != (XprType *)local_4b8.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_488,
                 local_4b8.m_storage.m_rows,1);
      pXVar31 = pXStack_480;
    }
    pPVar15 = local_3f8;
    pXVar24 = (XprType *)((long)pXVar31 - ((long)pXVar31 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pXVar31) {
      lVar28 = 0;
      do {
        ppuVar19 = (undefined **)(pdVar23 + lVar28);
        uVar27 = *(uint *)((long)ppuVar19 + 4);
        puVar3 = ppuVar19[1];
        ppMVar1 = (XprTypeNested *)local_488 + lVar28;
        *(undefined4 *)ppMVar1 = *(undefined4 *)ppuVar19;
        *(uint *)((long)ppMVar1 + 4) = uVar27 ^ 0x80000000;
        *(int *)(ppMVar1 + 1) = (int)puVar3;
        *(uint *)((long)ppMVar1 + 0xc) = (uint)((ulong)puVar3 >> 0x20) ^ 0x80000000;
        lVar28 = lVar28 + 2;
      } while (lVar28 < (long)pXVar24);
    }
    if ((long)pXVar24 < (long)pXVar31) {
      do {
        ppuVar19 = (undefined **)(pdVar23 + (long)pXVar24);
        uVar27 = *(uint *)((long)ppuVar19 + 4);
        *(undefined4 *)((XprTypeNested *)local_488 + (long)pXVar24) = *(undefined4 *)ppuVar19;
        *(uint *)((long)((XprTypeNested *)local_488 + (long)pXVar24) + 4) = uVar27 ^ 0x80000000;
        pXVar24 = (XprType *)((long)&pXVar24->m_xpr + 1);
      } while (pXVar31 != pXVar24);
    }
    dVar38 = getStepLength((Mesh *)local_3f8,(VectorXd *)error,(VectorXd *)local_488,
                           (VectorXd *)&local_3f0,&local_3b0,
                           *(double *)(&DAT_0019a810 + (ulong)(uVar33 == 0) * 8));
    local_448._8_4_ = extraout_XMM0_Dc_00;
    local_448._0_8_ = dVar38;
    local_448._12_4_ = extraout_XMM0_Dd_00;
    free((void *)local_488);
    getEnergy((Mesh *)pPVar15,(VectorXd *)error,local_3c8,true);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Step: ",6);
    poVar20 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_450);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," Norm of Gradient: ",0x13);
    local_4a8._0_8_ = local_430;
    if ((XprType *)local_430._8_8_ == (XprType *)0x0) {
      uVar36 = 0;
      uVar37 = 0;
    }
    else {
      pXStack_480 = (XprType *)local_430._0_8_;
      pXStack_470 = (XprType *)local_4a8;
      SVar11 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_488,(scalar_sum_op<double,_double> *)&local_4bc);
      uVar36 = SUB84(SVar11,0);
      uVar37 = (undefined4)((ulong)SVar11 >> 0x20);
    }
    poVar20 = std::ostream::_M_insert<double>(SQRT((double)CONCAT44(uVar37,uVar36)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
    pdVar23 = local_4b8.m_storage.m_data;
    iVar16 = (int)(local_3c0 * 0x24924925 >> 0x20);
    uVar27 = (((uint)((int)local_450 - iVar16) >> 1) + iVar16 >> 2) * -7 + (int)local_450;
    uVar26 = (ulong)(uVar27 * 0x10);
    pPVar29 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              ((long)&local_338.m_storage.m_data + uVar26);
    pXVar31 = (XprType *)local_4b8.m_storage.m_rows;
    if (*(XprType **)((long)&local_338.m_storage.m_rows + uVar26) !=
        (XprType *)local_4b8.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (pPVar29,local_4b8.m_storage.m_rows,1);
      pXVar31 = *(XprType **)((long)&local_338.m_storage.m_rows + uVar26);
    }
    pdVar5 = (pPVar29->m_storage).m_data;
    pXVar24 = (XprType *)((long)pXVar31 - ((long)pXVar31 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pXVar31) {
      lVar28 = 0;
      do {
        ppuVar19 = (undefined **)(pdVar23 + lVar28);
        puVar3 = ppuVar19[1];
        pdVar2 = pdVar5 + lVar28;
        *pdVar2 = -(double)*ppuVar19 * (double)local_448._0_8_;
        pdVar2[1] = -(double)puVar3 * (double)local_448._0_8_;
        lVar28 = lVar28 + 2;
      } while (lVar28 < (long)pXVar24);
    }
    if ((long)pXVar24 < (long)pXVar31) {
      do {
        pdVar5[(long)pXVar24] = -(double)pdVar23[(long)pXVar24] * (double)local_448._0_8_;
        pXVar24 = (XprType *)((long)&pXVar24->m_xpr + 1);
      } while (pXVar31 != pXVar24);
    }
    pdVar23 = (pPVar29->m_storage).m_data;
    dVar38 = *error;
    dVar6 = error[1];
    dVar32 = (double)((long)dVar6 - ((long)dVar6 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)dVar6) {
      lVar28 = 0;
      do {
        pdVar5 = pdVar23 + lVar28;
        pdVar2 = (double *)((long)dVar38 + lVar28 * 8);
        dVar12 = pdVar5[1] + pdVar2[1];
        auVar8._8_4_ = SUB84(dVar12,0);
        auVar8._0_8_ = *pdVar5 + *pdVar2;
        auVar8._12_4_ = (int)((ulong)dVar12 >> 0x20);
        *(undefined1 (*) [16])((long)dVar38 + lVar28 * 8) = auVar8;
        lVar28 = lVar28 + 2;
      } while (lVar28 < (long)dVar32);
    }
    if ((long)dVar32 < (long)dVar6) {
      do {
        *(double *)((long)dVar38 + (long)dVar32 * 8) =
             pdVar23[(long)dVar32] + *(double *)((long)dVar38 + (long)dVar32 * 8);
        dVar32 = (double)((long)dVar32 + 1);
      } while (dVar6 != dVar32);
    }
    calcGrad((Mesh *)local_488,(VectorXd *)local_3f8,local_3c8);
    uVar17 = local_430._0_8_;
    local_430._0_8_ = local_488;
    local_430._8_8_ = pXStack_480;
    free((void *)uVar17);
    pdVar23 = local_3f0.m_data;
    uVar17 = local_430._0_8_;
    this_01 = &local_3a8 + uVar27;
    uVar26 = local_3f0.m_rows;
    if ((&local_3a8)[uVar27].m_storage.m_rows != local_3f0.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (this_01,local_3f0.m_rows,1);
      uVar26 = (&local_3a8)[uVar27].m_storage.m_rows;
    }
    pdVar5 = (this_01->m_storage).m_data;
    uVar25 = uVar26 - ((long)uVar26 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar26) {
      lVar28 = 0;
      do {
        ppMVar1 = (XprTypeNested *)uVar17 + lVar28;
        pdVar2 = pdVar23 + lVar28;
        dVar38 = (double)ppMVar1[1] - pdVar2[1];
        auVar9._8_4_ = SUB84(dVar38,0);
        auVar9._0_8_ = (double)*ppMVar1 - *pdVar2;
        auVar9._12_4_ = (int)((ulong)dVar38 >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + lVar28) = auVar9;
        lVar28 = lVar28 + 2;
      } while (lVar28 < (long)uVar25);
    }
    if ((long)uVar25 < (long)uVar26) {
      do {
        pdVar5[uVar25] = (double)((XprTypeNested *)uVar17)[uVar25] - pdVar23[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar26 != uVar25);
    }
    uVar36 = 0;
    uVar37 = 0;
    local_4a8._0_8_ = pPVar29;
    local_4a8._8_8_ = this_01;
    if ((&local_3a8)[uVar27].m_storage.m_rows != 0) {
      pXStack_480 = (XprType *)(pPVar29->m_storage).m_data;
      pXStack_470 = (XprType *)(this_01->m_storage).m_data;
      local_460 = (XprType *)local_4a8;
      SVar10 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_488,(scalar_sum_op<double,_double> *)&local_4bc);
      uVar36 = SUB84(SVar10,0);
      uVar37 = (undefined4)((ulong)SVar10 >> 0x20);
    }
    adStack_2c8[uVar27] = 1.0 / (double)CONCAT44(uVar37,uVar36);
    free(local_4b8.m_storage.m_data);
    free(local_3f0.m_data);
    free(local_420.m_data);
    OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_290);
    uVar26 = local_450;
    local_488 = (undefined1  [8])local_430;
    uVar36 = 0;
    uVar37 = 0;
    if ((XprType *)local_430._8_8_ != (XprType *)0x0) {
      local_290._8_8_ = local_430._0_8_;
      local_278 = (XprType *)local_488;
      SVar11 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_290,(scalar_sum_op<double,_double> *)local_4a8);
      uVar36 = SUB84(SVar11,0);
      uVar37 = (undefined4)((ulong)SVar11 >> 0x20);
    }
    uVar26 = (ulong)((int)uVar26 + 1);
    if (SQRT((double)CONCAT44(uVar37,uVar36)) < *local_3b8 ||
        SQRT((double)CONCAT44(uVar37,uVar36)) == *local_3b8) {
      *(double *)
       &(local_3d0->super_Mesh).
        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
        .super_PolyConnectivity = *error;
      *(double *)
       &(local_3d0->super_Mesh).
        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
        .super_PolyConnectivity.field_0x8 = error[1];
      *error = 0.0;
      error[1] = 0.0;
      free((void *)local_430._0_8_);
      lVar28 = 0x70;
      do {
        free(*(void **)((long)&local_3b8 + lVar28));
        lVar28 = lVar28 + -0x10;
      } while (lVar28 != 0);
      lVar28 = 0x70;
      do {
        free(*(void **)((long)local_348 + lVar28));
        lVar28 = lVar28 + -0x10;
      } while (lVar28 != 0);
      tVar39.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      tVar39.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)local_3d0;
      return (type)tVar39.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
  } while( true );
}

Assistant:

auto LBFGS(Mesh& mesh, Eigen::VectorXd x, const double& error) {
    static constexpr int sz = 7;
    auto test = [&error](const Eigen::VectorXd& x) -> bool {
        return x.norm() > error;
    };

    Eigen::VectorXd ss[sz], ys[sz];
    double rhos[sz], alphas[sz];
    double epsilon = getAveLen(mesh, x) * 0.25f;
    Eigen::VectorXd gradx = calcGrad(mesh, x, epsilon);
    int k = 0;
    int step = 0;
    do{
        // Write intermediate result if test mode is enabled
        #ifdef TEST
            Mesh omesh;
            for (int i = 0; i < x.size(); i += 2) {
                OpenMesh::Vec3f vert(x[i], x[i + 1], 0.0f);
                omesh.add_vertex(vert);
            }
            for (auto face: mesh.all_faces()) {
                int cnt = 0;
                OpenMesh::VertexHandle handles[10];
                for (auto v: mesh.fv_range(face)) 
                    handles[cnt++] = v;
                omesh.add_face(handles, cnt);
            }
            if(k % 10 == 0 || k == 1)
                OpenMesh::IO::write_mesh(omesh, std::to_string(k) + "test" + "_param" +  ".obj");
        #endif
        auto q = gradx;
        auto gradx0 = gradx;
        Eigen::VectorXd r(x.size());
        for (int i = k - 1; i >= std::max(0, k - sz); --i) {
            alphas[i % sz] = q.dot(ss[i % sz]) * rhos[i % sz];
            q -= alphas[i % sz] * ys[i % sz]; 
        }
        if (k == 0)
            r = q;
        else r = ss[(k - 1) % sz].dot(ys[(k - 1) % sz]) / ys[(k - 1) % sz].dot(ys[(k - 1) % sz]) * q;
        for (int i = std::max(0, k - sz); i < k; ++i) {
            auto beta = rhos[i % sz] * r.dot(ys[i %sz]);
            r += ss[i % sz] * (alphas[i % sz] - beta);
        }
        double step_len = getStepLength(mesh, x, -r, gradx0, epsilon, k == 0 ? 1e-5 : 1.0);
        auto energy = getEnergy(mesh, x, epsilon, true);
        #ifdef TEST
            std::cout << "Step: " << step++ << " Norm of Gradient: "<< gradx.norm() << std::endl;
        #endif
        // update array for y, s, rho
        ss[k % sz] = step_len * -r;
        x += ss[k % sz];
        gradx = calcGrad(mesh, x, epsilon);
        ys[k % sz] = gradx - gradx0;
        rhos[k % sz] = 1.0 / ss[k % sz].dot(ys[k % sz]);
       
        ++k;
    }while(test(gradx));

    return std::move(x);
}